

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O3

ByteString * validate_chunk(ByteString *FB,ByteString *CB,ui32_t *nonce_value)

{
  byte_t (*pabVar1) [8];
  byte_t abVar2 [8];
  int iVar3;
  ui32_t *in_RCX;
  long lVar4;
  Result_t *pRVar5;
  ulong uVar6;
  CTR_Setup counter;
  CTR_Setup local_100;
  
  if (in_RCX == (ui32_t *)0x0) {
    __assert_fail("nonce_value",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                  ,0x14a,"Result_t validate_chunk(ByteString &, ByteString &, ui32_t *)");
  }
  if (*(byte_t **)(CB + 8) != (byte_t *)0x0) {
    CTR_Setup::SetupRead(&local_100,*(byte_t **)(CB + 8));
    if (*(long *)(nonce_value + 2) == 0) {
      __assert_fail("m_Data",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                    ,0x224,"byte_t *Kumu::ByteString::Data()");
    }
    lVar4 = *(long *)(nonce_value + 2) + 0x20;
    uVar6 = 0;
    do {
      abVar2[4] = (undefined1)local_100.m_ctr;
      abVar2[5] = local_100.m_ctr._1_1_;
      abVar2[6] = local_100.m_ctr._2_1_;
      abVar2[7] = local_100.m_ctr._3_1_;
      abVar2[0] = (undefined1)local_100.m_nonce;
      abVar2[1] = local_100.m_nonce._1_1_;
      abVar2[2] = local_100.m_nonce._2_1_;
      abVar2[3] = local_100.m_nonce._3_1_;
      pabVar1 = (byte_t (*) [8])(lVar4 + uVar6);
      *pabVar1 = local_100.m_preamble;
      pabVar1[1] = abVar2;
      Kumu::AES_encrypt(&local_100.m_Context,(uchar *)(uVar6 + lVar4));
      local_100.m_ctr = local_100.m_ctr + 1;
      uVar6 = uVar6 + 0x10;
    } while (uVar6 < 0xfffd1);
    if (*(long *)(CB + 8) != 0) {
      if (*(long *)(nonce_value + 2) != 0) {
        iVar3 = bcmp((void *)(*(long *)(CB + 8) + 0x20),(void *)(*(long *)(nonce_value + 2) + 0x20),
                     0xfffe0);
        if (iVar3 == 0) {
          *in_RCX = local_100.m_nonce;
          pRVar5 = (Result_t *)&Kumu::RESULT_OK;
        }
        else {
          validate_chunk();
          pRVar5 = (Result_t *)&Kumu::RESULT_FAIL;
        }
        Kumu::Result_t::Result_t((Result_t *)FB,pRVar5);
        return FB;
      }
    }
  }
  __assert_fail("m_Data",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                ,0x221,"const byte_t *Kumu::ByteString::RoData() const");
}

Assistant:

Result_t
validate_chunk(ByteString& FB, ByteString& CB, ui32_t* nonce_value)
{
  assert(nonce_value);
  CTR_Setup counter;
  counter.SetupRead(FB.RoData());

  counter.FillRandom(CB.Data() + counter.WriteSize(),
		     Megabyte - counter.WriteSize());

  if ( memcmp(FB.RoData() + counter.WriteSize(),
	      CB.RoData() + counter.WriteSize(),
	      Megabyte - counter.WriteSize()) != 0 )
    {
      fprintf(stderr, "Check data mismatched in chunk\n");
      return RESULT_FAIL;
    }

  *nonce_value = counter.Nonce();

  return RESULT_OK;
}